

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O1

void __thiscall ncnn::PoolAllocator::~PoolAllocator(PoolAllocator *this)

{
  pthread_mutex_t *__mutex;
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  (this->super_Allocator)._vptr_Allocator = (_func_int **)&PTR__PoolAllocator_0034e920;
  clear(this);
  if ((this->d->payouts).
      super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->d->payouts) {
    ~PoolAllocator((PoolAllocator *)&this->d);
  }
  __mutex = (pthread_mutex_t *)this->d;
  if (__mutex == (pthread_mutex_t *)0x0) {
    return;
  }
  puVar2 = *(undefined8 **)((long)__mutex + 0x70);
  while (puVar2 != (undefined8 *)((long)__mutex + 0x70)) {
    puVar1 = (undefined8 *)*puVar2;
    operator_delete(puVar2,0x20);
    puVar2 = puVar1;
  }
  puVar2 = *(undefined8 **)((long)__mutex + 0x58);
  while (puVar2 != (undefined8 *)((long)__mutex + 0x58)) {
    puVar1 = (undefined8 *)*puVar2;
    operator_delete(puVar2,0x20);
    puVar2 = puVar1;
  }
  pthread_mutex_destroy(__mutex + 1);
  pthread_mutex_destroy(__mutex);
  operator_delete(__mutex,0x88);
  return;
}

Assistant:

PoolAllocator::~PoolAllocator()
{
    clear();

    if (!d->payouts.empty())
    {
        NCNN_LOGE("FATAL ERROR! pool allocator destroyed too early");
#if NCNN_STDIO
        std::list<std::pair<size_t, void*> >::iterator it = d->payouts.begin();
        for (; it != d->payouts.end(); ++it)
        {
            void* ptr = it->second;
            NCNN_LOGE("%p still in use", ptr);
        }
#endif
    }

    delete d;
}